

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_contains_all(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *b2;
  int i;
  bitset_t *subset;
  bitset_t *superset;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    if (iVar2 % 2 == 0) {
      bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
  }
  _Var1 = bitset_contains_all(b1,b2);
  if (!_Var1) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all",0xf8);
    exit(1);
  }
  _Var1 = bitset_contains_all(b1,b2);
  if (_Var1) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all",0xf9);
    exit(1);
  }
  bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  _Var1 = bitset_contains_all(b1,b2);
  if (!_Var1) {
    _Var1 = bitset_contains_all(b1,b2);
    if (!_Var1) {
      bitset_free((bitset_t *)0x1023d9);
      bitset_free((bitset_t *)0x1023e3);
      return;
    }
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all",0xfe);
    exit(1);
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_contains_all",0xfd);
  exit(1);
}

Assistant:

void test_contains_all() {
  bitset_t *superset = bitset_create();
  bitset_t *subset = bitset_create();

  for (int i = 0; i < 1000; i++) {
    bitset_set(superset, i);
    if (i % 2 == 0)
      bitset_set(subset, i);
  }

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_set(subset, 1001);

  TEST_ASSERT(!bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}